

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  WalkerManager *this;
  vector<rect,_std::allocator<rect>_> rs;
  Mat *in_stack_00000188;
  vector<rect,_std::allocator<rect>_> *in_stack_00000190;
  Mat image;
  int i;
  WalkerManager *manager;
  Mat *in_stack_fffffffffffffda8;
  _InputArray *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  int NumWalkers;
  Size in_stack_fffffffffffffdd8;
  undefined1 local_219 [25];
  WalkerManager *in_stack_fffffffffffffe00;
  WalkerManager *in_stack_fffffffffffffe08;
  undefined1 local_1e0 [200];
  Mat *in_stack_fffffffffffffee8;
  WalkerManager *in_stack_fffffffffffffef0;
  Mat local_80 [96];
  undefined4 local_20;
  WalkerManager *local_10;
  undefined4 local_4;
  
  NumWalkers = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_4 = 0;
  this = (WalkerManager *)operator_new(0x20);
  WalkerManager::WalkerManager(this,NumWalkers);
  local_10 = this;
  do {
    local_20 = 100;
    cv::Mat::zeros((int)local_1e0,600,600);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)in_stack_fffffffffffffdd8);
    cv::MatExpr::~MatExpr((MatExpr *)in_stack_fffffffffffffdb0);
    WalkerManager::UpdateAllWalkers(in_stack_fffffffffffffe00);
    WalkerManager::ShowAllWalkers(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    WalkerManager::GetRectFromManager(in_stack_fffffffffffffe08);
    tracker_function(in_stack_00000190,in_stack_00000188);
    in_stack_fffffffffffffdb0 = (_InputArray *)local_219;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_219 + 1),"image ",(allocator *)in_stack_fffffffffffffdb0);
    cv::_InputArray::_InputArray(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    cv::imshow((string *)(local_219 + 1),(_InputArray *)&stack0xfffffffffffffdc8);
    cv::_InputArray::~_InputArray((_InputArray *)&stack0xfffffffffffffdc8);
    std::__cxx11::string::~string((string *)(local_219 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_219);
    cv::waitKey(0x32);
    std::vector<rect,_std::allocator<rect>_>::~vector((vector<rect,_std::allocator<rect>_> *)this);
    cv::Mat::~Mat(local_80);
  } while( true );
}

Assistant:

int main()
{
    WalkerManager* manager = new WalkerManager(3);

    for(int i=0; i=100; ++i)
    {
        cv::Mat image = cv::Mat::zeros(600, 600, CV_8UC3);
        manager->UpdateAllWalkers();
        manager->ShowAllWalkers(image);

        std::vector<rect> rs = manager->GetRectFromManager();
        tracker_function(rs, image);

        cv::imshow("image ", image);
        cv::waitKey(50);
    }

    delete manager;
}